

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManSetOutputRequireds(Nf_Man_t *p,int fPropCompl)

{
  uint uVar1;
  Vec_Flt_t *pVVar2;
  Nf_Obj_t *pNVar3;
  undefined1 auVar4 [16];
  Scl_Con_t *pSVar5;
  int *piVar6;
  Jf_Par_t *pJVar7;
  Gia_Man_t *pGVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  size_t __size;
  undefined1 *puVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  
  iVar13 = p->pPars->MapDelay;
  bVar20 = false;
  pSVar5 = Scl_ConReadMan();
  if (pSVar5 != (Scl_Con_t *)0x0) {
    pSVar5 = Scl_ConReadMan();
    iVar19 = (pSVar5->vOutReqs).nSize;
    iVar14 = 0;
    if (0 < (long)iVar19) {
      lVar11 = 0;
      iVar14 = 0;
      do {
        iVar14 = iVar14 + (uint)((pSVar5->vOutReqs).pArray[lVar11] == 0);
        lVar11 = lVar11 + 1;
      } while (iVar19 != lVar11);
    }
    bVar20 = iVar14 != iVar19;
  }
  iVar19 = p->pGia->nObjs;
  uVar12 = (long)iVar19 * 2;
  iVar14 = (int)uVar12;
  if ((p->vRequired).nCap < iVar14) {
    piVar6 = (p->vRequired).pArray;
    __size = (long)iVar19 << 3;
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc(__size);
    }
    else {
      piVar6 = (int *)realloc(piVar6,__size);
    }
    (p->vRequired).pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vRequired).nCap = iVar14;
  }
  auVar4 = _DAT_0094e250;
  if (0 < iVar19) {
    piVar6 = (p->vRequired).pArray;
    lVar11 = (uVar12 & 0xffffffff) - 1;
    auVar21._8_4_ = (int)lVar11;
    auVar21._0_8_ = lVar11;
    auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar12 = 0;
    auVar21 = auVar21 ^ _DAT_0094e250;
    auVar23 = _DAT_0094f530;
    auVar24 = _DAT_0094e240;
    do {
      auVar25 = auVar24 ^ auVar4;
      iVar19 = auVar21._4_4_;
      if ((bool)(~(auVar25._4_4_ == iVar19 && auVar21._0_4_ < auVar25._0_4_ ||
                  iVar19 < auVar25._4_4_) & 1)) {
        piVar6[uVar12] = 0x3fffffff;
      }
      if ((auVar25._12_4_ != auVar21._12_4_ || auVar25._8_4_ <= auVar21._8_4_) &&
          auVar25._12_4_ <= auVar21._12_4_) {
        piVar6[uVar12 + 1] = 0x3fffffff;
      }
      auVar25 = auVar23 ^ auVar4;
      iVar26 = auVar25._4_4_;
      if (iVar26 <= iVar19 && (iVar26 != iVar19 || auVar25._0_4_ <= auVar21._0_4_)) {
        piVar6[uVar12 + 2] = 0x3fffffff;
        piVar6[uVar12 + 3] = 0x3fffffff;
      }
      uVar12 = uVar12 + 4;
      lVar11 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar11 + 4;
      lVar11 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar11 + 4;
    } while ((iVar14 + 3U & 0xfffffffc) != uVar12);
  }
  (p->vRequired).nSize = iVar14;
  pJVar7 = p->pPars;
  pJVar7->MapDelay = 0;
  pGVar8 = p->pGia;
  lVar11 = (long)pGVar8->vCos->nSize;
  if (lVar11 < 1) {
    iVar19 = 0;
  }
  else {
    piVar6 = pGVar8->vCos->pArray;
    iVar19 = 0;
    lVar17 = 0;
    do {
      iVar14 = piVar6[lVar17];
      if (((long)iVar14 < 0) || (pGVar8->nObjs <= iVar14)) goto LAB_00791342;
      if (pGVar8->pObjs == (Gia_Obj_t *)0x0) break;
      uVar1 = *(uint *)(pGVar8->pObjs + iVar14);
      iVar14 = *(int *)((long)&p->pNfObjs[(int)(iVar14 - (uVar1 & 0x1fffffff))].M[0][0].D +
                       (ulong)(uVar1 >> 0x18 & 0x20));
      if (iVar19 <= iVar14) {
        iVar19 = iVar14;
      }
      pJVar7->MapDelay = iVar19;
      lVar17 = lVar17 + 1;
    } while (lVar11 != lVar17);
  }
  if (((p->Iter != 0) && (iVar13 < iVar19)) && (pGVar8->vOutReqs == (Vec_Flt_t *)0x0)) {
    printf("******** Critical delay violation %.2f -> %.2f ********\n",
           (double)((float)iVar13 / 1000.0),(double)((float)iVar19 / 1000.0));
    pJVar7 = p->pPars;
    iVar19 = pJVar7->MapDelay;
  }
  if (iVar13 < iVar19) {
    iVar13 = iVar19;
  }
  pJVar7->MapDelay = iVar13;
  fVar22 = pJVar7->MapDelayTarget;
  if (((fVar22 == 0.0) && (!NAN(fVar22))) && (pJVar7->nRelaxRatio != 0)) {
    fVar22 = (float)(((pJVar7->nRelaxRatio + 100) * iVar13) / 100);
    pJVar7->MapDelayTarget = fVar22;
  }
  if (0.0 < fVar22) {
    if (fVar22 <= (float)iVar13) {
      if (pJVar7->nRelaxRatio == 0) {
        Abc_Print(0,"Relaxing user-specified delay target from %.2f to %.2f.\n",
                  (double)((float)(int)fVar22 / 1000.0),(double)((float)iVar13 / 1000.0));
      }
    }
    else {
      pJVar7->MapDelay = (int)fVar22;
    }
  }
  pGVar8 = p->pGia;
  pVVar10 = pGVar8->vCos;
  if (0 < pVVar10->nSize) {
    lVar11 = 0;
    do {
      uVar1 = pVVar10->pArray[lVar11];
      if (((long)(int)uVar1 < 0) || (pGVar8->nObjs <= (int)uVar1)) {
LAB_00791342:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar8->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar18 = *(uint *)(pGVar8->pObjs + (int)uVar1);
      uVar16 = uVar18 & 0x1fffffff;
      iVar13 = uVar1 - uVar16;
      uVar18 = uVar18 >> 0x1d & 1;
      pJVar7 = p->pPars;
      if (pJVar7->fDoAverage == 0) {
        iVar19 = pJVar7->MapDelay;
      }
      else {
        iVar19 = ((pJVar7->nRelaxRatio + 100) *
                 *(int *)((long)&p->pNfObjs[iVar13].M[0][0].D + (ulong)(uVar18 << 5))) / 100;
      }
      if (bVar20) {
        pSVar5 = Scl_ConReadMan();
        if ((pSVar5->vOutReqs).nSize <= lVar11) goto LAB_00791361;
        if (0 < (pSVar5->vOutReqs).pArray[lVar11]) {
          pSVar5 = Scl_ConReadMan();
          if ((pSVar5->vOutReqs).nSize <= lVar11) goto LAB_00791361;
          if (iVar19 <= (pSVar5->vOutReqs).pArray[lVar11]) {
            pSVar5 = Scl_ConReadMan();
            if ((pSVar5->vOutReqs).nSize <= lVar11) goto LAB_00791361;
            iVar19 = (pSVar5->vOutReqs).pArray[lVar11];
          }
        }
      }
      else {
        pVVar2 = pGVar8->vOutReqs;
        if (pVVar2 != (Vec_Flt_t *)0x0) {
          if (pVVar2->nSize <= lVar11) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                          ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
          }
          iVar14 = (int)(pVVar2->pArray[lVar11] * 1000.0);
          if (((0 < iVar14) && (iVar19 <= iVar14)) && (iVar19 = iVar19 * 2, iVar14 <= iVar19)) {
            iVar19 = iVar14;
          }
        }
      }
      if (iVar13 < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      uVar9 = uVar18 + iVar13 * 2;
      if ((p->vRequired).nSize <= (int)uVar9) {
LAB_00791361:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar6 = (p->vRequired).pArray;
      if (iVar19 < piVar6[uVar9]) {
        piVar6[uVar9] = iVar19;
      }
      if ((fPropCompl != 0) && (uVar1 != uVar16)) {
        pNVar3 = p->pNfObjs;
        uVar18 = uVar18 << 5;
        uVar1 = *(uint *)(&pNVar3[iVar13].M[0][0].field_0x0 + uVar18);
        uVar16 = *(uint *)(&pNVar3[iVar13].M[0][1].field_0x0 + uVar18);
        if (-1 < (int)(uVar16 ^ uVar1)) {
          __assert_fail("pD->fBest != pA->fBest",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaNf.c"
                        ,0x583,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
        }
        puVar15 = (undefined1 *)0x0;
        if ((int)uVar1 < 0) {
          puVar15 = &pNVar3[iVar13].M[0][0].field_0x0 + uVar18;
        }
        if ((int)uVar16 < 0) {
          puVar15 = &pNVar3[iVar13].M[0][1].field_0x0 + uVar18;
        }
        if ((puVar15[3] & 0x40) != 0) {
          uVar9 = uVar9 ^ 1;
          if ((p->vRequired).nSize <= (int)uVar9) goto LAB_00791361;
          iVar19 = iVar19 - p->InvDelayI;
          if (iVar19 < piVar6[uVar9]) {
            piVar6[uVar9] = iVar19;
          }
        }
      }
      lVar11 = lVar11 + 1;
      pGVar8 = p->pGia;
      pVVar10 = pGVar8->vCos;
    } while (lVar11 < pVVar10->nSize);
  }
  return;
}

Assistant:

void Nf_ManSetOutputRequireds( Nf_Man_t * p, int fPropCompl )
{
    Gia_Obj_t * pObj;
    int Required = 0, MapDelayOld = p->pPars->MapDelay;
    int fUseConMan = Scl_ConIsRunning() && Scl_ConHasOutReqs();
    int i, iObj, fCompl, nLits = 2*Gia_ManObjNum(p->pGia);
    Vec_IntFill( &p->vRequired, nLits, SCL_INFINITY );
    // compute delay
    p->pPars->MapDelay = 0;
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        Required = Nf_ObjMatchD( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj) )->D;
        p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, Required );
    }
    if ( p->Iter && MapDelayOld < p->pPars->MapDelay && p->pGia->vOutReqs == NULL )
        printf( "******** Critical delay violation %.2f -> %.2f ********\n", Scl_Int2Flt(MapDelayOld), Scl_Int2Flt(p->pPars->MapDelay) ); 
    p->pPars->MapDelay = Abc_MaxInt( p->pPars->MapDelay, MapDelayOld );
    // check delay target
    if ( p->pPars->MapDelayTarget == 0 && p->pPars->nRelaxRatio )
        p->pPars->MapDelayTarget = p->pPars->MapDelay * (100 + p->pPars->nRelaxRatio) / 100;
    if ( p->pPars->MapDelayTarget > 0 )
    {
        if ( p->pPars->MapDelay < p->pPars->MapDelayTarget )
            p->pPars->MapDelay = p->pPars->MapDelayTarget;
        else if ( p->pPars->nRelaxRatio == 0 )
            Abc_Print( 0, "Relaxing user-specified delay target from %.2f to %.2f.\n", Scl_Int2Flt(p->pPars->MapDelayTarget), Scl_Int2Flt(p->pPars->MapDelay) );
    }
    //assert( p->pPars->MapDelayTarget == 0 );
    // set required times
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj     = Gia_ObjFaninId0p(p->pGia, pObj);
        fCompl   = Gia_ObjFaninC0(pObj);
        Required = Nf_ObjMatchD(p, iObj, fCompl)->D;
        Required = p->pPars->fDoAverage ? Required * (100 + p->pPars->nRelaxRatio) / 100 : p->pPars->MapDelay;
        // if external required time can be achieved, use it
        if ( fUseConMan )
        {
            if ( Scl_ConGetOutReq(i) > 0 && Required <= Scl_ConGetOutReq(i) )
                Required = Scl_ConGetOutReq(i);
        }
        else if ( p->pGia->vOutReqs )
        {
            int NewRequired = Scl_Flt2Int(Vec_FltEntry(p->pGia->vOutReqs, i));
            if ( NewRequired > 0 && Required <= NewRequired )
                Required = Abc_MinInt( 2*Required, NewRequired );
        }
        // if external required cannot be achieved, set the earliest possible arrival time
//        else if ( p->pGia->vOutReqs && Vec_FltEntry(p->pGia->vOutReqs, i) > 0 && Required > Vec_FltEntry(p->pGia->vOutReqs, i) )
//            ptTime->Rise = ptTime->Fall = ptTime->Worst = Required;
        // otherwise, set the global required time
        Nf_ObjUpdateRequired( p, iObj, fCompl, Required );
        if ( fPropCompl && iObj > 0 && Nf_ObjMatchBest(p, iObj, fCompl)->fCompl )
            Nf_ObjUpdateRequired( p, iObj, !fCompl, Required - p->InvDelayI );
        //Nf_ObjMapRefInc( p, Gia_ObjFaninId0p(p->pGia, pObj), Gia_ObjFaninC0(pObj));
    }
}